

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<std::pair<unsigned_int,_wasm::Name>_> * __thiscall
wasm::IRBuilder::getExtraOutputLocalAndLabel
          (Result<std::pair<unsigned_int,_wasm::Name>_> *__return_storage_ptr__,IRBuilder *this,
          Index label,size_t extraArity)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *this_00;
  long lVar3;
  pointer pNVar4;
  undefined8 uVar5;
  char *pcVar6;
  void *pvVar7;
  __index_type *p_Var8;
  Name NVar9;
  Iterator __first;
  Iterator __last;
  undefined1 local_f0 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  Type labelType;
  Type extraType;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_98;
  Index local_8c;
  undefined1 auStack_88 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  Result<wasm::Name> name;
  
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)local_f0,this,label);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)auStack_88,
                  (_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_f0);
  if (_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 8);
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20),
               CONCAT44(auStack_88._4_4_,auStack_88._0_4_),
               CONCAT44(_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u.
                        _4_4_,_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              _M_u._0_4_) + CONCAT44(auStack_88._4_4_,auStack_88._0_4_));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
             0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> = puVar2;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ == puVar1) {
      *puVar2 = CONCAT71(name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._9_7_,
                         name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x18)
           = name.val.super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> =
           _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>
                + 0x10) =
           CONCAT71(name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._9_7_,
                    name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 8) =
         name.val.super__Variant_base<wasm::Name,_wasm::Err>.
         super__Move_assign_alias<wasm::Name,_wasm::Err>.
         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
         super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>
         .super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.super_IString
         .str._M_len;
    name.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.super_IString.str.
    _M_len = 0;
    name.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20) =
         '\x01';
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ = puVar1;
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)auStack_88)
    ;
    goto LAB_00c978ae;
  }
  local_8c = label;
  std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)auStack_88);
  this_00 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_f0 + 0x70);
  if ((ulong)((long)*(pointer *)((long)local_f0 + 0x78) -
              (long)(((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_f0 + 0x70))->
                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 4) < extraArity) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_f0 + 0x58),
               extraArity);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::resize(this_00,extraArity);
  }
  lVar3 = extraArity - 1;
  if ((this_00->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar3].super_IString.str._M_str == (char *)0x0) {
    local_98 = this_00;
    if ((*(__index_type *)((long)local_f0 + 0x18) == '\x05') && (*(long *)local_f0 != 0)) {
      scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ =
           ((Type *)((long)local_f0 + 0x48))->id;
    }
    else {
      scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ =
           ScopeCtx::getResultType((ScopeCtx *)local_f0);
    }
    p_Var8 = (__index_type *)
             ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20);
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)p_Var8;
    __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = extraArity;
    __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)p_Var8;
    std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_88,__first,__last,
               (allocator_type *)
               ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
    wasm::Type::Type(&labelType,(Tuple *)auStack_88);
    pvVar7 = (void *)CONCAT44(auStack_88._4_4_,auStack_88._0_4_);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,CONCAT44(_val.val.
                                      super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      ._M_u._12_4_,
                                      _val.val.
                                      super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      .
                                      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                      ._M_u._8_4_) - (long)pvVar7);
    }
    addScratchLocal((Result<unsigned_int> *)auStack_88,this,labelType);
    std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
               ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)auStack_88);
    if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
      extraType.id = (uintptr_t)&local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&extraType,
                 _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_,
                 name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
                 super_IString.str._M_len +
                 _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                       super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                       super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>
               + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> = puVar2;
      if ((undefined1 *)extraType.id == &local_a8) {
        *puVar2 = CONCAT71(uStack_a7,local_a8);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x18
         ) = uStack_a0;
      }
      else {
        *(uintptr_t *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> =
             extraType.id;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                          super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                          super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                          super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                          super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                          super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>
                  + 0x10) = CONCAT71(uStack_a7,local_a8);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 8) =
           local_b0;
      local_a8 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20)
           = '\x01';
      extraType.id = (uintptr_t)&local_a8;
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)auStack_88);
      goto LAB_00c978ae;
    }
    name.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._39_1_ =
         name.val.super__Variant_base<wasm::Name,_wasm::Err>.
         super__Move_assign_alias<wasm::Name,_wasm::Err>.
         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
         super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>
         .super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_;
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
               ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
    getLabelName((Result<wasm::Name> *)
                 ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20),this
                 ,local_8c,false);
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_f0 + 0x58))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_start[extraArity - 1] = auStack_88._0_4_;
    p_Var8 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20);
    if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
      p_Var8 = (__index_type *)0x0;
    }
    NVar9.super_IString.str._M_str = *(char **)(p_Var8 + 8);
    NVar9.super_IString.str._M_len =
         _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_;
    NVar9 = makeFresh(this,NVar9,0);
    pNVar4 = (local_98->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar4[lVar3].super_IString.str._M_len = NVar9.super_IString.str._M_len;
    pNVar4[lVar3].super_IString.str._M_str = NVar9.super_IString.str._M_str;
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)auStack_88);
    if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._39_1_ == '\x01') goto LAB_00c978ae;
  }
  pNVar4 = (((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_f0 + 0x70))->
           super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar3;
  uVar5 = (pNVar4->super_IString).str._M_len;
  pcVar6 = (pNVar4->super_IString).str._M_str;
  auStack_88._4_4_ = (undefined4)uVar5;
  _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._0_4_ =
       (undefined4)((ulong)uVar5 >> 0x20);
  _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._4_4_ = SUB84(pcVar6,0);
  _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._8_4_ =
       (undefined4)((ulong)pcVar6 >> 0x20);
  *(uint *)&(__return_storage_ptr__->val).
            super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> =
       (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_f0 + 0x58))->
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start[extraArity - 1];
  *(ulong *)((long)&(__return_storage_ptr__->val).
                    super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 4
            ) = CONCAT44(auStack_88._4_4_,auStack_88._0_4_);
  *(ulong *)((long)&(__return_storage_ptr__->val).
                    super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                    super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
            0xc) =
       CONCAT44(_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._4_4_,
                _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._0_4_);
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x14) =
       _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
       super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._8_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
           super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20) =
       '\0';
LAB_00c978ae:
  std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

Result<std::pair<Index, Name>>
IRBuilder::getExtraOutputLocalAndLabel(Index label, size_t extraArity) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  auto& s = **scope;
  auto i = extraArity - 1;
  if (s.outputLabels.size() < extraArity) {
    s.outputLocals.resize(extraArity);
    s.outputLabels.resize(extraArity);
  }
  if (!s.outputLabels[i]) {
    auto labelType = s.getLabelType();
    auto it = labelType.begin();
    Type extraType = Tuple(it, it + extraArity);
    auto local = addScratchLocal(extraType);
    CHECK_ERR(local);
    auto name = getLabelName(label);
    s.outputLocals[i] = *local;
    s.outputLabels[i] = makeFresh(*name);
  }

  return std::make_pair(s.outputLocals[i], s.outputLabels[i]);
}